

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O1

int ptls_server_handle_message
              (ptls_t *tls,ptls_buffer_t *sendbuf,size_t *epoch_offsets,size_t in_epoch,void *input,
              size_t inlen,ptls_handshake_properties_t *properties)

{
  int iVar1;
  size_t sVar2;
  st_ptls_raw_message_emitter_t emitter;
  st_ptls_record_t local_60;
  ptls_message_emitter_t local_48;
  undefined8 local_20;
  size_t *local_18;
  
  if ((tls->field_0x1e8 & 1) == 0) {
    __assert_fail("tls->is_server",
                  "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/t/../lib/picotls.c"
                  ,0x1a00,
                  "int ptls_server_handle_message(ptls_t *, ptls_buffer_t *, size_t *, size_t, const void *, size_t, ptls_handshake_properties_t *)"
                 );
  }
  local_48.enc = &(tls->traffic_protection).enc;
  local_48.record_header_length = 0;
  local_48.begin_message = begin_raw_message;
  local_48.commit_message = commit_raw_message;
  local_20 = 0xffffffffffffffff;
  local_60.type = '\x16';
  local_60.version = 0;
  local_60.length = inlen;
  local_60.fragment = (uint8_t *)input;
  local_48.buf = sendbuf;
  local_18 = epoch_offsets;
  if (tls->state == PTLS_STATE_SERVER_GENERATING_CERTIFICATE_VERIFY) {
    if (inlen != 0 && input != (void *)0x0) {
      __assert_fail("input == NULL || inlen == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/t/../lib/picotls.c"
                    ,0x1a07,
                    "int ptls_server_handle_message(ptls_t *, ptls_buffer_t *, size_t *, size_t, const void *, size_t, ptls_handshake_properties_t *)"
                   );
    }
    iVar1 = server_finish_handshake(tls,&local_48,1,(st_ptls_signature_algorithms_t *)0x0);
  }
  else {
    if (input == (void *)0x0) {
      __assert_fail("input != NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/t/../lib/picotls.c"
                    ,0x1a0b,
                    "int ptls_server_handle_message(ptls_t *, ptls_buffer_t *, size_t *, size_t, const void *, size_t, ptls_handshake_properties_t *)"
                   );
    }
    sVar2 = ptls_get_read_epoch(tls);
    iVar1 = 10;
    if (sVar2 == in_epoch) {
      iVar1 = handle_handshake_record
                        (tls,handle_server_handshake_message,&local_48,&local_60,properties);
    }
  }
  return iVar1;
}

Assistant:

int ptls_server_handle_message(ptls_t *tls, ptls_buffer_t *sendbuf, size_t epoch_offsets[5], size_t in_epoch, const void *input,
                               size_t inlen, ptls_handshake_properties_t *properties)
{
    assert(tls->is_server);

    struct st_ptls_raw_message_emitter_t emitter = {
        {sendbuf, &tls->traffic_protection.enc, 0, begin_raw_message, commit_raw_message}, SIZE_MAX, epoch_offsets};
    struct st_ptls_record_t rec = {PTLS_CONTENT_TYPE_HANDSHAKE, 0, inlen, input};

    if (tls->state == PTLS_STATE_SERVER_GENERATING_CERTIFICATE_VERIFY) {
        assert(input == NULL || inlen == 0);
        return server_finish_handshake(tls, &emitter.super, 1, NULL);
    }

    assert(input != NULL);

    if (ptls_get_read_epoch(tls) != in_epoch)
        return PTLS_ALERT_UNEXPECTED_MESSAGE;

    return handle_handshake_record(tls, handle_server_handshake_message, &emitter.super, &rec, properties);
}